

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testConstList(void)

{
  Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> this;
  Point2d *pPVar1;
  int y;
  int x;
  ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> it2;
  Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> it;
  Point2d *point;
  List<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::mem::Delete<Point2d>_>
  list;
  ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
  *in_stack_ffffffffffffff38;
  intptr_t in_stack_ffffffffffffff40;
  IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  *in_stack_ffffffffffffff48;
  Point2d *in_stack_ffffffffffffff50;
  ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
  *in_stack_ffffffffffffff58;
  IteratorImpl<axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_const_Point2d,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  local_50;
  IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  local_48;
  IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  local_40;
  IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  local_38;
  void *local_20;
  
  axl::sl::
  List<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::mem::Delete<Point2d>_>::
  List((List<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::mem::Delete<Point2d>_>
        *)0x116fa4);
  local_20 = operator_new(0x18);
  *(undefined4 *)((long)local_20 + 0x10) = 10;
  *(undefined4 *)((long)local_20 + 0x14) = 0x14;
  local_38.
  super_IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
          )axl::sl::
           ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
           ::insertTail(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_20 = operator_new(0x18);
  *(undefined4 *)((long)local_20 + 0x10) = 0x1e;
  *(undefined4 *)((long)local_20 + 0x14) = 0x28;
  local_40.
  super_IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
          )axl::sl::
           ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
           ::insertTail(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_48.
  super_IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
          )axl::sl::
           ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
           ::getHead(in_stack_ffffffffffffff38);
  axl::sl::ConstIterator<Point2d,axl::sl::ImplicitPtrCast<Point2d,axl::sl::ListLink>>::
  ConstIterator<Point2d,axl::sl::ImplicitPtrCast<Point2d,axl::sl::ListLink>>
            ((ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> *)
             in_stack_ffffffffffffff50,
             (Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> *)
             in_stack_ffffffffffffff48);
  axl::sl::ConstIterator<Point2d,axl::sl::ImplicitPtrCast<Point2d,axl::sl::ListLink>>::
  ConstIterator<Point2d,axl::sl::ImplicitPtrCast<Point2d,axl::sl::ListLink>>
            ((ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> *)
             in_stack_ffffffffffffff50,
             (Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> *)
             in_stack_ffffffffffffff48);
  axl::sl::
  IteratorBase<axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_const_Point2d,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  ::operator++((IteratorBase<axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_const_Point2d,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
                *)in_stack_ffffffffffffff38,0);
  this = axl::sl::
         IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
         ::getInc(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  axl::sl::ConstIterator<Point2d,axl::sl::ImplicitPtrCast<Point2d,axl::sl::ListLink>>::
  ConstIterator<Point2d,axl::sl::ImplicitPtrCast<Point2d,axl::sl::ListLink>>
            ((ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> *)
             this.
             super_IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
             .
             super_IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
             .m_p,(Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_> *)
                  in_stack_ffffffffffffff48);
  axl::sl::
  IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  ::operator->(&local_48);
  axl::sl::
  IteratorImpl<axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_const_Point2d,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
  ::operator->(&local_50);
  pPVar1 = axl::sl::
           IteratorImpl<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
           ::operator->(&local_48);
  pPVar1->m_x = 0;
  axl::sl::
  List<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::mem::Delete<Point2d>_>::
  ~List((List<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::mem::Delete<Point2d>_>
         *)0x117184);
  return;
}

Assistant:

void
testConstList() {
	sl::List<Point2d> list;

	Point2d* point = new Point2d;
	point->m_x = 10;
	point->m_y = 20;
	list.insertTail(point);

	point = new Point2d;
	point->m_x = 30;
	point->m_y = 40;
	list.insertTail(point);

	sl::Iterator<Point2d> it = list.getHead();
	sl::ConstIterator<Point2d> it2 = it;
	it2 = it;
	it2++;

	it2 = it.getInc(1);

	int x = it->m_x;
	int y = it2->m_y;

	it->m_x = 0;

//	it->m_x = 10;
//	it->m_y = 20;
}